

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgtweak.c
# Opt level: O2

void paramSync(void)

{
  if (Param[0].value != (uint)DAT_001060e1) {
    DAT_001060e1 = (byte)Param[0].value;
    zvgDmaPutc(0xe2);
    zvgDmaPutc(DAT_001060e1);
  }
  if (Param[1].value != (uint)DAT_001060e2) {
    DAT_001060e2 = (byte)Param[1].value;
    zvgDmaPutc(0xe3);
    zvgDmaPutc(DAT_001060e2);
  }
  if (Param[6].value != (uint)DAT_001060e3) {
    DAT_001060e3 = (byte)Param[6].value;
    zvgDmaPutc(0xe4);
    zvgDmaPutc(DAT_001060e3);
  }
  if (Param[7].value != (uint)DAT_001060e4) {
    DAT_001060e4 = (byte)Param[7].value;
    zvgDmaPutc(0xe5);
    zvgDmaPutc(DAT_001060e4);
  }
  if (Param[2].value != (uint)DAT_001060e6) {
    DAT_001060e6 = (byte)Param[2].value;
    zvgDmaPutc(0xe8);
    zvgDmaPutc(DAT_001060e6);
  }
  if (Param[3].value != (uint)DAT_001060e5) {
    DAT_001060e5 = (byte)Param[3].value;
    zvgDmaPutc(0xe7);
    zvgDmaPutc(DAT_001060e5);
  }
  if (Param[4].value != (uint)ZvgMon) {
    ZvgMon = (byte)Param[4].value;
    zvgDmaPutc(0xe6);
    zvgDmaPutc(ZvgMon);
  }
  if (Param[5].value == (uint)DAT_001060e7) {
    return;
  }
  DAT_001060e7 = (byte)Param[5].value;
  zvgDmaPutc(0xe9);
  zvgDmaPutc(DAT_001060e7);
  return;
}

Assistant:

void paramSync( void)
{
	if (Param[ZSHIFT].value != ZvgMon.zShift)
	{	ZvgMon.zShift = Param[ZSHIFT].value;
		zvgDmaPutc( zcZSHIFT);
		zvgDmaPutc( ZvgMon.zShift);
	}

	if (Param[ZOSHOOT].value != ZvgMon.oShoot)
	{	ZvgMon.oShoot = Param[ZOSHOOT].value;
		zvgDmaPutc( zcOSHOOT);
		zvgDmaPutc( ZvgMon.oShoot);
	}

	if (Param[ZJUMP].value != ZvgMon.jumpFactor)
	{	ZvgMon.jumpFactor = Param[ZJUMP].value;
		zvgDmaPutc( zcJUMP);
		zvgDmaPutc( ZvgMon.jumpFactor);
	}

	if (Param[ZSETTLE].value != ZvgMon.settle)
	{	ZvgMon.settle = Param[ZSETTLE].value;
		zvgDmaPutc( zcSETTLE);
		zvgDmaPutc( ZvgMon.settle);
	}

	if (Param[ZMAXINT].value != ZvgMon.max_i)
	{	ZvgMon.max_i = Param[ZMAXINT].value;
		zvgDmaPutc( zcMAX_I);
		zvgDmaPutc( ZvgMon.max_i);
	}

	if (Param[ZMININT].value != ZvgMon.min_i)
	{	ZvgMon.min_i = Param[ZMININT].value;
		zvgDmaPutc( zcMIN_I);
		zvgDmaPutc( ZvgMon.min_i);
	}

	if (Param[ZPOINT].value != ZvgMon.point_i)
	{	ZvgMon.point_i = Param[ZPOINT].value;
		zvgDmaPutc( zcPOINT_I);
		zvgDmaPutc( ZvgMon.point_i);
	}

	if (Param[ZSIZE].value != ZvgMon.scale)
	{	ZvgMon.scale = Param[ZSIZE].value;
		zvgDmaPutc( zcSCALE);
		zvgDmaPutc( ZvgMon.scale);
	}
}